

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O2

void __thiscall rcg::ImageList::add(ImageList *this,Buffer *buffer,uint32_t part)

{
  const_iterator __position;
  Image *this_00;
  shared_ptr<const_rcg::Image> sStack_38;
  
  this_00 = (Image *)operator_new(0x58);
  Image::Image(this_00,buffer,part);
  std::__shared_ptr<rcg::Image_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Image,void>
            ((__shared_ptr<rcg::Image_const,(__gnu_cxx::_Lock_policy)2> *)&sStack_38,this_00);
  std::vector<std::shared_ptr<rcg::Image_const>,std::allocator<std::shared_ptr<rcg::Image_const>>>::
  emplace_back<std::shared_ptr<rcg::Image_const>>
            ((vector<std::shared_ptr<rcg::Image_const>,std::allocator<std::shared_ptr<rcg::Image_const>>>
              *)&this->list,&sStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_38.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  while (__position._M_current =
              (this->list).
              super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
        this->maxsize <
        (ulong)((long)(this->list).
                      super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current >> 4)
        ) {
    std::
    vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>::
    erase(&this->list,__position);
  }
  return;
}

Assistant:

void ImageList::add(const Buffer *buffer, uint32_t part)
{
  list.push_back(std::shared_ptr<const Image>(new Image(buffer, part)));

  while (list.size() > maxsize)
  {
    list.erase(list.begin());
  }
}